

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

bool update(svm_params *params,size_t pos)

{
  float fVar1;
  svm_model *psVar2;
  svm_example *this;
  float *pfVar3;
  float *pfVar4;
  size_t i_1;
  ulong uVar5;
  size_t sVar6;
  float fVar7;
  float dot_prod;
  float fVar8;
  float fVar9;
  float fVar10;
  
  psVar2 = params->model;
  this = (psVar2->support_vec)._begin[pos];
  svm_example::compute_kernels(this,params);
  pfVar3 = (this->krow)._begin;
  fVar8 = 0.0;
  for (sVar6 = 0; psVar2->num_support != sVar6; sVar6 = sVar6 + 1) {
    fVar8 = fVar8 + pfVar3[sVar6] * (psVar2->alpha)._begin[sVar6];
  }
  (psVar2->delta)._begin[pos] = ((this->ex).l.simple.label * fVar8) / params->lambda + -1.0;
  pfVar4 = (psVar2->alpha)._begin;
  fVar1 = pfVar4[pos];
  fVar10 = pfVar3[pos];
  pfVar4[pos] = 0.0;
  fVar7 = (this->ex).l.simple.label;
  fVar9 = (this->ex).l.simple.weight;
  fVar8 = (params->lambda - (fVar8 - fVar10 * fVar1) * fVar7) / pfVar3[pos];
  if ((fVar8 <= fVar9) && (fVar9 = fVar8, fVar8 < 0.0)) {
    fVar9 = 0.0;
  }
  fVar7 = fVar7 * fVar9;
  fVar8 = fVar7 - fVar1;
  fVar10 = ABS(fVar8);
  if (1.0 < fVar10) {
    fVar8 = (float)(-(uint)(0.0 < fVar8) & 0x3f800000) - (float)(-(uint)(fVar8 < 0.0) & 0x3f800000);
    fVar7 = fVar1 + fVar8;
  }
  for (uVar5 = 0; uVar5 < psVar2->num_support; uVar5 = uVar5 + 1) {
    pfVar4 = (psVar2->delta)._begin;
    pfVar4[uVar5] =
         (pfVar3[uVar5] * fVar8 * ((psVar2->support_vec)._begin[uVar5]->ex).l.simple.label) /
         params->lambda + pfVar4[uVar5];
  }
  if (ABS(fVar7) <= 1e-10) {
    remove((char *)params);
  }
  else {
    (psVar2->alpha)._begin[pos] = fVar7;
  }
  return 1e-06 < fVar10;
}

Assistant:

bool update(svm_params& params, size_t pos)
{
  // params.all->opts_n_args.trace_message<<"Update\n";
  svm_model* model = params.model;
  bool overshoot = false;
  // params.all->opts_n_args.trace_message<<"Updating model "<<pos<<" "<<model->num_support<<" ";
  svm_example* fec = model->support_vec[pos];
  label_data& ld = fec->ex.l.simple;
  fec->compute_kernels(params);
  float* inprods = fec->krow.begin();
  float alphaKi = dense_dot(inprods, model->alpha, model->num_support);
  model->delta[pos] = alphaKi * ld.label / params.lambda - 1;
  float alpha_old = model->alpha[pos];
  alphaKi -= model->alpha[pos] * inprods[pos];
  model->alpha[pos] = 0.;

  float proj = alphaKi * ld.label;
  float ai = (params.lambda - proj) / inprods[pos];
  // cout<<model->num_support<<" "<<pos<<" "<<proj<<" "<<alphaKi<<" "<<alpha_old<<" "<<ld.label<<"
  // "<<model->delta[pos]<<" " << ai<<" "<<params.lambda<<endl;

  if (ai > fec->ex.l.simple.weight)
    ai = fec->ex.l.simple.weight;
  else if (ai < 0)
    ai = 0;

  ai *= ld.label;
  float diff = ai - alpha_old;

  if (fabs(diff) > 1.0e-06)
    overshoot = true;

  if (fabs(diff) > 1.)
  {
    // params.all->opts_n_args.trace_message<<"Here\n";
    diff = (float)(diff > 0) - (diff < 0);
    ai = alpha_old + diff;
  }

  for (size_t i = 0; i < model->num_support; i++)
  {
    label_data& ldi = model->support_vec[i]->ex.l.simple;
    model->delta[i] += diff * inprods[i] * ldi.label / params.lambda;
  }

  if (fabs(ai) <= 1.0e-10)
    remove(params, pos);
  else
    model->alpha[pos] = ai;

  return overshoot;
}